

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_mp3_read_pcm_frames_raw(ma_dr_mp3 *pMP3,ma_uint64 framesToRead,void *pBufferOut)

{
  uint uVar1;
  ma_uint32 mVar2;
  ma_uint64 mVar3;
  ulong uVar4;
  
  mVar3 = 0;
  while( true ) {
    if (framesToRead == 0) {
      return mVar3;
    }
    uVar1 = pMP3->pcmFramesRemainingInMP3Frame;
    uVar4 = framesToRead & 0xffffffff;
    if (uVar1 <= framesToRead) {
      uVar4 = (ulong)uVar1;
    }
    if (pBufferOut != (void *)0x0) {
      memcpy((void *)((long)pBufferOut + mVar3 * pMP3->channels * 2),
             pMP3->pcmFrames +
             (ulong)pMP3->mp3FrameChannels * (ulong)pMP3->pcmFramesConsumedInMP3Frame * 2,
             pMP3->channels * uVar4 * 2);
      uVar1 = pMP3->pcmFramesRemainingInMP3Frame;
    }
    pMP3->currentPCMFrame = pMP3->currentPCMFrame + uVar4;
    pMP3->pcmFramesConsumedInMP3Frame = pMP3->pcmFramesConsumedInMP3Frame + (int)uVar4;
    pMP3->pcmFramesRemainingInMP3Frame = uVar1 - (int)uVar4;
    mVar3 = mVar3 + uVar4;
    framesToRead = framesToRead - uVar4;
    if (framesToRead == 0) break;
    mVar2 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)pMP3->pcmFrames);
    if (mVar2 == 0) {
      return mVar3;
    }
  }
  return mVar3;
}

Assistant:

static ma_uint64 ma_dr_mp3_read_pcm_frames_raw(ma_dr_mp3* pMP3, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(pMP3->onRead != NULL);
    while (framesToRead > 0) {
        ma_uint32 framesToConsume = (ma_uint32)MA_DR_MP3_MIN(pMP3->pcmFramesRemainingInMP3Frame, framesToRead);
        if (pBufferOut != NULL) {
        #if defined(MA_DR_MP3_FLOAT_OUTPUT)
            float* pFramesOutF32 = (float*)MA_DR_MP3_OFFSET_PTR(pBufferOut,          sizeof(float) * totalFramesRead                   * pMP3->channels);
            float* pFramesInF32  = (float*)MA_DR_MP3_OFFSET_PTR(&pMP3->pcmFrames[0], sizeof(float) * pMP3->pcmFramesConsumedInMP3Frame * pMP3->mp3FrameChannels);
            MA_DR_MP3_COPY_MEMORY(pFramesOutF32, pFramesInF32, sizeof(float) * framesToConsume * pMP3->channels);
        #else
            ma_int16* pFramesOutS16 = (ma_int16*)MA_DR_MP3_OFFSET_PTR(pBufferOut,          sizeof(ma_int16) * totalFramesRead                   * pMP3->channels);
            ma_int16* pFramesInS16  = (ma_int16*)MA_DR_MP3_OFFSET_PTR(&pMP3->pcmFrames[0], sizeof(ma_int16) * pMP3->pcmFramesConsumedInMP3Frame * pMP3->mp3FrameChannels);
            MA_DR_MP3_COPY_MEMORY(pFramesOutS16, pFramesInS16, sizeof(ma_int16) * framesToConsume * pMP3->channels);
        #endif
        }
        pMP3->currentPCMFrame              += framesToConsume;
        pMP3->pcmFramesConsumedInMP3Frame  += framesToConsume;
        pMP3->pcmFramesRemainingInMP3Frame -= framesToConsume;
        totalFramesRead                    += framesToConsume;
        framesToRead                       -= framesToConsume;
        if (framesToRead == 0) {
            break;
        }
        MA_DR_MP3_ASSERT(pMP3->pcmFramesRemainingInMP3Frame == 0);
        if (ma_dr_mp3_decode_next_frame(pMP3) == 0) {
            break;
        }
    }
    return totalFramesRead;
}